

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_get_nz_map_contexts_c
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  char cVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  int col;
  int iVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  
  iVar4 = (int)CONCAT71(in_register_00000009,tx_size);
  uVar12 = 10;
  if (iVar4 < 0x11) {
    uVar3 = 3;
    if ((1 < iVar4 - 0xbU) && (iVar4 != 4)) goto LAB_001c03a8;
  }
  else {
    bVar2 = 4;
    if (iVar4 == 0x12) goto LAB_001c03e9;
    if (iVar4 == 0x11) {
      uVar12 = 9;
      bVar2 = 5;
      goto LAB_001c03e9;
    }
LAB_001c03a8:
    uVar3 = (ulong)tx_size;
  }
  bVar2 = (byte)tx_size_high_log2[uVar3];
  uVar11 = (uint)tx_size;
  if (uVar11 < 0x11) {
    uVar12 = 3;
    if ((uVar11 - 0xb < 2) || (uVar11 == 4)) goto LAB_001c03e9;
  }
  else {
    if (uVar11 == 0x11) {
      uVar12 = 9;
      goto LAB_001c03e9;
    }
    if (uVar11 == 0x12) goto LAB_001c03e9;
  }
  uVar12 = (ulong)tx_size;
LAB_001c03e9:
  if (eob != 0) {
    uVar11 = eob - 1;
    lVar5 = (long)(1 << (bVar2 & 0x1f));
    lVar6 = (long)(2 << (bVar2 & 0x1f));
    iVar13 = tx_size_wide[uVar12] << (bVar2 & 0x1f);
    bVar17 = -1 < tx_size_wide[uVar12] << (bVar2 & 0x1f);
    iVar4 = iVar13 + 7;
    if (bVar17) {
      iVar4 = iVar13;
    }
    iVar16 = iVar13 + 3;
    if (bVar17) {
      iVar16 = iVar13;
    }
    bVar10 = iVar16 >> 2 < (int)uVar11 | 2;
    if ((int)uVar11 <= iVar4 >> 3) {
      bVar10 = 1;
    }
    if (uVar11 == 0) {
      bVar10 = 0;
    }
    uVar12 = 0;
    do {
      uVar15 = (uint)scan[uVar12];
      bVar7 = bVar10;
      if (uVar11 != uVar12) {
        iVar4 = (int)uVar15 >> (bVar2 & 0x1f);
        lVar9 = (long)(int)(uVar15 + iVar4 * 4);
        iVar13 = (uint)""[levels[lVar9 + 1]] + (uint)""[levels[lVar5 + 4 + lVar9]];
        if (tx_class == '\x02') {
          iVar13 = iVar13 + (uint)""[levels[lVar9 + 3]] + (uint)""[levels[lVar9 + 2]];
          pbVar14 = levels + lVar9 + 4;
        }
        else if (tx_class == '\0') {
          iVar13 = iVar13 + (uint)""[levels[lVar6 + lVar9 + 8]] +
                            (uint)""[levels[lVar5 + lVar9 + 5]];
          pbVar14 = levels + lVar9 + 2;
        }
        else {
          iVar13 = iVar13 + (uint)""[levels[(long)(3 << (bVar2 & 0x1f)) + lVar9 + 0xc]] +
                            (uint)""[levels[lVar6 + lVar9 + 8]];
          pbVar14 = levels + (4 << (bVar2 & 0x1f)) + lVar9 + 0x10;
        }
        bVar7 = 0;
        if (uVar15 != 0 || tx_class != '\0') {
          uVar8 = iVar13 + (uint)""[*pbVar14] + 1 >> 1;
          if (3 < uVar8) {
            uVar8 = 4;
          }
          cVar1 = (char)uVar8;
          if (tx_class == '\x02') {
            bVar7 = cVar1 + (char)nz_map_ctx_offset_1d[uVar15 & ~(-1 << (bVar2 & 0x1f))];
          }
          else if (tx_class == '\x01') {
            bVar7 = cVar1 + (char)nz_map_ctx_offset_1d[iVar4];
          }
          else if (tx_class == '\0') {
            bVar7 = cVar1 + av1_nz_map_ctx_offset[tx_size][(int)uVar15];
          }
        }
      }
      coeff_contexts[(int)uVar15] = bVar7;
      uVar12 = uVar12 + 1;
    } while (eob != uVar12);
  }
  return;
}

Assistant:

void av1_get_nz_map_contexts_c(const uint8_t *const levels,
                               const int16_t *const scan, const uint16_t eob,
                               const TX_SIZE tx_size, const TX_CLASS tx_class,
                               int8_t *const coeff_contexts) {
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  for (int i = 0; i < eob; ++i) {
    const int pos = scan[i];
    coeff_contexts[pos] = get_nz_map_ctx(levels, pos, bhl, width, i,
                                         i == eob - 1, tx_size, tx_class);
  }
}